

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O0

mallinfo * internal_mallinfo(mallinfo *__return_storage_ptr__,mstate m)

{
  ulong uVar1;
  bool bVar2;
  ulong local_60;
  size_t sz;
  mchunkptr q;
  msegmentptr s;
  size_t sum;
  size_t mfree;
  size_t nfree;
  mstate m_local;
  
  memset(__return_storage_ptr__,0,0x50);
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (m->top != (mchunkptr)0x0) {
    mfree = 1;
    s = (msegmentptr)(m->topsize + 0x50);
    sum = (size_t)s;
    for (q = (mchunkptr)&m->seg; q != (mchunkptr)0x0; q = q->fd) {
      if ((q->prev_foot + 0x10 & 0xf) == 0) {
        local_60 = 0;
      }
      else {
        local_60 = 0x10 - (q->prev_foot + 0x10 & 0xf) & 0xf;
      }
      sz = q->prev_foot + local_60;
      while( true ) {
        bVar2 = false;
        if (((q->prev_foot <= sz) && (bVar2 = false, sz < q->prev_foot + q->head)) &&
           (bVar2 = false, (mchunkptr)sz != m->top)) {
          bVar2 = *(long *)(sz + 8) != 0xb;
        }
        if (!bVar2) break;
        uVar1 = *(ulong *)(sz + 8) & 0xfffffffffffffff8;
        s = (msegmentptr)((long)&s->base + uVar1);
        if ((*(ulong *)(sz + 8) & 3) == 1) {
          sum = uVar1 + sum;
          mfree = mfree + 1;
        }
        sz = sz + (*(ulong *)(sz + 8) & 0xfffffffffffffff8);
      }
    }
    __return_storage_ptr__->arena = (size_t)s;
    __return_storage_ptr__->ordblks = mfree;
    __return_storage_ptr__->hblkhd = m->footprint - (long)s;
    __return_storage_ptr__->usmblks = m->max_footprint;
    __return_storage_ptr__->uordblks = m->footprint - sum;
    __return_storage_ptr__->fordblks = sum;
    __return_storage_ptr__->keepcost = m->topsize;
  }
  return __return_storage_ptr__;
}

Assistant:

static struct mallinfo internal_mallinfo(mstate m) {
  struct mallinfo nm = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
  ensure_initialization();
  if (!PREACTION(m)) {
    check_malloc_state(m);
    if (is_initialized(m)) {
      size_t nfree = SIZE_T_ONE; /* top always free */
      size_t mfree = m->topsize + TOP_FOOT_SIZE;
      size_t sum = mfree;
      msegmentptr s = &m->seg;
      while (s != 0) {
        mchunkptr q = align_as_chunk(s->base);
        while (segment_holds(s, q) &&
               q != m->top && q->head != FENCEPOST_HEAD) {
          size_t sz = chunksize(q);
          sum += sz;
          if (!is_inuse(q)) {
            mfree += sz;
            ++nfree;
          }
          q = next_chunk(q);
        }
        s = s->next;
      }

      nm.arena    = sum;
      nm.ordblks  = nfree;
      nm.hblkhd   = m->footprint - sum;
      nm.usmblks  = m->max_footprint;
      nm.uordblks = m->footprint - mfree;
      nm.fordblks = mfree;
      nm.keepcost = m->topsize;
    }

    POSTACTION(m);
  }
  return nm;
}